

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O3

RPCHelpMan * getmempoolinfo(void)

{
  size_type *psVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  RPCHelpMan *in_RDI;
  undefined8 uVar5;
  long lVar6;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  undefined8 in_stack_fffffffffffff2d8;
  undefined8 in_stack_fffffffffffff2e8;
  undefined8 in_stack_fffffffffffff2f0;
  undefined8 in_stack_fffffffffffff2f8;
  code *pcVar7;
  undefined8 in_stack_fffffffffffff300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff308;
  pointer in_stack_fffffffffffff318;
  pointer pRVar8;
  pointer in_stack_fffffffffffff320;
  pointer pRVar9;
  pointer in_stack_fffffffffffff328;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff330;
  pointer pRVar11;
  pointer pRVar12;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff350;
  pointer pRVar14;
  pointer pRVar15;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c88;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c68;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c48;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c28;
  vector<RPCResult,_std::allocator<RPCResult>_> local_c08;
  vector<RPCResult,_std::allocator<RPCResult>_> local_be8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_bc8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ba8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b88;
  RPCResults local_b70;
  vector<RPCArg,_std::allocator<RPCArg>_> local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  ulong *local_a78;
  undefined8 local_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  ulong *local_a58;
  size_type local_a50;
  ulong local_a48;
  undefined8 uStack_a40;
  long *local_a38 [2];
  long local_a28 [2];
  long *local_a18 [2];
  long local_a08 [2];
  long *local_9f8 [2];
  long local_9e8 [2];
  long *local_9d8 [2];
  long local_9c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  size_type *local_998;
  size_type local_990;
  size_type local_988;
  undefined8 uStack_980;
  long *local_978 [2];
  long local_968 [2];
  long *local_958 [2];
  long local_948 [2];
  long *local_938 [2];
  long local_928 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  size_type *local_8f8;
  size_type local_8f0;
  size_type local_8e8;
  undefined8 uStack_8e0;
  long *local_8d8 [2];
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  long *local_898 [2];
  long local_888 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  size_type *local_858;
  size_type local_850;
  size_type local_848;
  undefined8 uStack_840;
  long *local_838 [2];
  long local_828 [2];
  long *local_818 [2];
  long local_808 [2];
  long *local_7f8 [2];
  long local_7e8 [2];
  long *local_7d8 [2];
  long local_7c8 [2];
  long *local_7b8 [2];
  long local_7a8 [2];
  long *local_798 [2];
  long local_788 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_778;
  long *local_758 [2];
  long local_748 [2];
  pointer local_738 [2];
  undefined1 local_728 [152];
  RPCResult local_690;
  RPCResult local_608;
  RPCResult local_580;
  RPCResult local_4f8;
  RPCResult local_470;
  RPCResult local_3e8;
  RPCResult local_360;
  RPCResult local_2d8;
  RPCResult local_250;
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getmempoolinfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Returns details on the active state of the TX memory pool.","");
  local_120[0] = local_110;
  local_b58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_738[0] = (pointer)local_728;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"loaded","");
  local_758[0] = local_748;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_758,
             "True if the initial load attempt of the persisted mempool finished","");
  local_ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description._M_string_length = in_stack_fffffffffffff300;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description.field_2 = in_stack_fffffffffffff308;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff320;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff318;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult
            ((RPCResult *)(local_728 + 0x10),BOOL,m_key_name,description,inner,SUB81(local_738,0));
  local_778.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_778.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"size","");
  local_798[0] = local_788;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"Current tx count","");
  local_bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_00._M_string_length = in_stack_fffffffffffff300;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_00.field_2 = in_stack_fffffffffffff308;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult(&local_690,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_778,0));
  local_7b8[0] = local_7a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"bytes","");
  local_7d8[0] = local_7c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7d8,
             "Sum of all virtual transaction sizes as defined in BIP 141. Differs from actual serialized size because witness data is discounted"
             ,"");
  local_be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_01._M_string_length = in_stack_fffffffffffff300;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_01.field_2 = in_stack_fffffffffffff308;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult(&local_608,NUM,m_key_name_01,description_01,inner_01,SUB81(local_7b8,0));
  local_7f8[0] = local_7e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f8,"usage","");
  local_818[0] = local_808;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_818,"Total memory usage for the mempool","");
  local_c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_02._M_string_length = in_stack_fffffffffffff300;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_02.field_2 = in_stack_fffffffffffff308;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult(&local_580,NUM,m_key_name_02,description_02,inner_02,SUB81(local_7f8,0));
  local_838[0] = local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"total_fee","");
  std::operator+(&local_878,"Total fees for the mempool in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_878,", ignoring modified fees through prioritisetransaction");
  local_858 = &local_848;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar4) {
    local_848 = paVar4->_M_allocated_capacity;
    uStack_840 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_848 = paVar4->_M_allocated_capacity;
    local_858 = psVar1;
  }
  local_850 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_03._M_string_length = in_stack_fffffffffffff300;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_03.field_2 = in_stack_fffffffffffff308;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult
            (&local_4f8,STR_AMOUNT,m_key_name_03,description_03,inner_03,SUB81(local_838,0));
  local_898[0] = local_888;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_898,"maxmempool","");
  local_8b8[0] = local_8a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8b8,"Maximum memory usage for the mempool","");
  local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_04._M_string_length = in_stack_fffffffffffff300;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_04.field_2 = in_stack_fffffffffffff308;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult(&local_470,NUM,m_key_name_04,description_04,inner_04,SUB81(local_898,0));
  local_8d8[0] = local_8c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"mempoolminfee","");
  std::operator+(&local_918,"Minimum fee rate in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_918,
                      "/kvB for tx to be accepted. Is the maximum of minrelaytxfee and minimum mempool fee"
                     );
  local_8f8 = &local_8e8;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar4) {
    local_8e8 = paVar4->_M_allocated_capacity;
    uStack_8e0 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_8e8 = paVar4->_M_allocated_capacity;
    local_8f8 = psVar1;
  }
  local_8f0 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_c68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_05._M_string_length = (size_type)in_RDI;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_05._M_string_length = in_stack_fffffffffffff300;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_05.field_2 = in_stack_fffffffffffff308;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult
            (&local_3e8,STR_AMOUNT,m_key_name_05,description_05,inner_05,SUB81(local_8d8,0));
  local_938[0] = local_928;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"minrelaytxfee","");
  local_958[0] = local_948;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_958,"Current minimum relay fee for transactions","");
  local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_string_length = (size_type)in_RDI;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_06._M_string_length = in_stack_fffffffffffff300;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_06.field_2 = in_stack_fffffffffffff308;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult
            (&local_360,STR_AMOUNT,m_key_name_06,description_06,inner_06,SUB81(local_938,0));
  local_978[0] = local_968;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"incrementalrelayfee","");
  std::operator+(&local_9b8,"minimum fee rate increment for mempool limiting or replacement in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_9b8,"/kvB");
  local_998 = &local_988;
  psVar1 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar4) {
    local_988 = paVar4->_M_allocated_capacity;
    uStack_980 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_988 = paVar4->_M_allocated_capacity;
    local_998 = psVar1;
  }
  local_990 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  m_key_name_07._M_string_length = (size_type)in_RDI;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_07._M_string_length = in_stack_fffffffffffff300;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_07.field_2 = in_stack_fffffffffffff308;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult(&local_2d8,NUM,m_key_name_07,description_07,inner_07,SUB81(local_978,0));
  local_9d8[0] = local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"unbroadcastcount","");
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9f8,
             "Current number of transactions that haven\'t passed initial broadcast yet","");
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  m_key_name_08._M_string_length = (size_type)in_RDI;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_08.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_08._M_string_length = in_stack_fffffffffffff300;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_08.field_2 = in_stack_fffffffffffff308;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff320;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff318;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff328;
  RPCResult::RPCResult(&local_250,NUM,m_key_name_08,description_08,inner_08,SUB81(local_9d8,0));
  local_a18[0] = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"fullrbf","");
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,
             "True if the mempool accepts RBF without replaceability signaling inspection","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_09._M_string_length = (size_type)in_RDI;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_09.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_09._M_string_length = in_stack_fffffffffffff300;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_09.field_2._M_local_buf = in_stack_fffffffffffff308._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_1c8,BOOL,m_key_name_09,description_09,inner_09,SUB81(local_a18,0));
  __l._M_len = 0xb;
  __l._M_array = (iterator)(local_728 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_b88,__l,(allocator_type *)&stack0xfffffffffffff317);
  m_key_name_10._M_string_length = (size_type)in_RDI;
  m_key_name_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2d8;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_fffffffffffff2e8;
  m_key_name_10.field_2._8_8_ = in_stack_fffffffffffff2f0;
  description_10._M_string_length = in_stack_fffffffffffff300;
  description_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff2f8;
  description_10.field_2 = in_stack_fffffffffffff308;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar9;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar10;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_10,description_10,inner_10,SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff2d8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff2e8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff2f0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff2f8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff300;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff308;
  result._64_8_ = pRVar8;
  result.m_description._M_dataplus._M_p = (pointer)pRVar9;
  result.m_description._M_string_length = (size_type)pRVar10;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff330;
  result.m_description.field_2._8_8_ = pRVar11;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar12;
  result.m_cond._M_string_length = (size_type)pRVar13;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff350;
  result.m_cond.field_2._8_8_ = pRVar14;
  RPCResults::RPCResults(&local_b70,result);
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab8,"getmempoolinfo","");
  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad8,"");
  HelpExampleCli(&local_a98,&local_ab8,&local_ad8);
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"getmempoolinfo","");
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b38,"");
  HelpExampleRpc(&local_af8,&local_b18,&local_b38);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    uVar5 = local_a98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_af8._M_string_length + local_a98._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
      uVar5 = local_af8.field_2._M_allocated_capacity;
    }
    if (local_af8._M_string_length + local_a98._M_string_length <= (ulong)uVar5) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_af8,0,0,local_a98._M_dataplus._M_p,local_a98._M_string_length);
      goto LAB_00a00fc2;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_a98,local_af8._M_dataplus._M_p,local_af8._M_string_length);
LAB_00a00fc2:
  local_a78 = &local_a68;
  puVar2 = (ulong *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar4) {
    local_a68 = paVar4->_M_allocated_capacity;
    uStack_a60 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_a68 = paVar4->_M_allocated_capacity;
    local_a78 = puVar2;
  }
  local_a50 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  if (local_a78 == &local_a68) {
    uStack_a40 = uStack_a60;
    local_a58 = &local_a48;
  }
  else {
    local_a58 = local_a78;
  }
  local_a48 = local_a68;
  local_a70 = 0;
  local_a68 = local_a68 & 0xffffffffffffff00;
  pcVar7 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mempool.cpp:710:9)>
           ::_M_manager;
  description_11._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mempool.cpp:710:9)>
       ::_M_invoke;
  description_11._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mempool.cpp:710:9)>
                ::_M_manager;
  description_11.field_2 = in_stack_fffffffffffff308;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff330;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar12;
  examples.m_examples._M_string_length = in_stack_fffffffffffff350;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar13;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar14;
  examples.m_examples.field_2._8_8_ = pRVar15;
  local_a78 = &local_a68;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff2e8)),description_11,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xfffffffffffff2e8,&stack0xfffffffffffff2e8,3);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58,local_a48 + 1);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78,local_a68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b70.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b88);
  lVar6 = 0x5d8;
  do {
    if ((long *)(local_728 + lVar6) != *(long **)((long)local_738 + lVar6)) {
      operator_delete(*(long **)((long)local_738 + lVar6),*(long *)(local_728 + lVar6) + 1);
    }
    if ((long *)((long)local_748 + lVar6) != *(long **)((long)local_758 + lVar6)) {
      operator_delete(*(long **)((long)local_758 + lVar6),*(long *)((long)local_748 + lVar6) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_778.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar6));
    if ((long *)((long)local_788 + lVar6) != *(long **)((long)local_798 + lVar6)) {
      operator_delete(*(long **)((long)local_798 + lVar6),*(long *)((long)local_788 + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x88;
  } while (lVar6 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff318);
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0],local_a28[0] + 1);
  }
  if (local_a18[0] != local_a08) {
    operator_delete(local_a18[0],local_a08[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff338);
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0],local_9e8[0] + 1);
  }
  if (local_9d8[0] != local_9c8) {
    operator_delete(local_9d8[0],local_9c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff358);
  if (local_998 != &local_988) {
    operator_delete(local_998,local_988 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  if (local_978[0] != local_968) {
    operator_delete(local_978[0],local_968[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c88);
  if (local_958[0] != local_948) {
    operator_delete(local_958[0],local_948[0] + 1);
  }
  if (local_938[0] != local_928) {
    operator_delete(local_938[0],local_928[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c68);
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8,local_8e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  if (local_8d8[0] != local_8c8) {
    operator_delete(local_8d8[0],local_8c8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c48);
  if (local_8b8[0] != local_8a8) {
    operator_delete(local_8b8[0],local_8a8[0] + 1);
  }
  if (local_898[0] != local_888) {
    operator_delete(local_898[0],local_888[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c28);
  if (local_858 != &local_848) {
    operator_delete(local_858,local_848 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if (local_838[0] != local_828) {
    operator_delete(local_838[0],local_828[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_c08);
  if (local_818[0] != local_808) {
    operator_delete(local_818[0],local_808[0] + 1);
  }
  if (local_7f8[0] != local_7e8) {
    operator_delete(local_7f8[0],local_7e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_be8);
  if (local_7d8[0] != local_7c8) {
    operator_delete(local_7d8[0],local_7c8[0] + 1);
  }
  if (local_7b8[0] != local_7a8) {
    operator_delete(local_7b8[0],local_7a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_bc8);
  if (local_798[0] != local_788) {
    operator_delete(local_798[0],local_788[0] + 1);
  }
  if (local_778.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_778.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_778.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_778.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ba8);
  if (local_758[0] != local_748) {
    operator_delete(local_758[0],local_748[0] + 1);
  }
  if (local_738[0] != (pointer)local_728) {
    operator_delete(local_738[0],local_728._0_8_ + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_b58);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmempoolinfo()
{
    return RPCHelpMan{"getmempoolinfo",
        "Returns details on the active state of the TX memory pool.",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::BOOL, "loaded", "True if the initial load attempt of the persisted mempool finished"},
                {RPCResult::Type::NUM, "size", "Current tx count"},
                {RPCResult::Type::NUM, "bytes", "Sum of all virtual transaction sizes as defined in BIP 141. Differs from actual serialized size because witness data is discounted"},
                {RPCResult::Type::NUM, "usage", "Total memory usage for the mempool"},
                {RPCResult::Type::STR_AMOUNT, "total_fee", "Total fees for the mempool in " + CURRENCY_UNIT + ", ignoring modified fees through prioritisetransaction"},
                {RPCResult::Type::NUM, "maxmempool", "Maximum memory usage for the mempool"},
                {RPCResult::Type::STR_AMOUNT, "mempoolminfee", "Minimum fee rate in " + CURRENCY_UNIT + "/kvB for tx to be accepted. Is the maximum of minrelaytxfee and minimum mempool fee"},
                {RPCResult::Type::STR_AMOUNT, "minrelaytxfee", "Current minimum relay fee for transactions"},
                {RPCResult::Type::NUM, "incrementalrelayfee", "minimum fee rate increment for mempool limiting or replacement in " + CURRENCY_UNIT + "/kvB"},
                {RPCResult::Type::NUM, "unbroadcastcount", "Current number of transactions that haven't passed initial broadcast yet"},
                {RPCResult::Type::BOOL, "fullrbf", "True if the mempool accepts RBF without replaceability signaling inspection"},
            }},
        RPCExamples{
            HelpExampleCli("getmempoolinfo", "")
            + HelpExampleRpc("getmempoolinfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    return MempoolInfoToJSON(EnsureAnyMemPool(request.context));
},
    };
}